

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::MILSpec::TensorValue::ByteSizeLong(TensorValue *this)

{
  TensorValue_RepeatedFloats *pTVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    pTVar1 = (this->value_).floats_;
    uVar8 = (ulong)(uint)(pTVar1->values_).current_size_;
    uVar5 = uVar8 * 4;
    break;
  case 2:
    sVar4 = TensorValue_RepeatedInts::ByteSizeLong((this->value_).ints_);
    goto LAB_002e3eb4;
  case 3:
    pTVar1 = (this->value_).floats_;
    uVar5 = (ulong)(uint)(pTVar1->values_).current_size_;
    uVar8 = uVar5;
    break;
  case 4:
    sVar4 = TensorValue_RepeatedStrings::ByteSizeLong((this->value_).strings_);
    goto LAB_002e3eb4;
  case 5:
    sVar4 = TensorValue_RepeatedLongInts::ByteSizeLong((this->value_).longints_);
LAB_002e3eb4:
    uVar7 = (uint)sVar4 | 1;
    iVar3 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    goto LAB_002e3f6a;
  case 6:
    pTVar1 = (this->value_).floats_;
    uVar8 = (ulong)(uint)(pTVar1->values_).current_size_;
    uVar5 = uVar8 * 8;
    break;
  case 7:
    sVar2 = ((((this->value_).bytes_)->values_).ptr_)->_M_string_length;
    if (sVar2 == 0) {
      lVar6 = 0;
    }
    else {
      uVar7 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar6 = sVar2 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    ((this->value_).bytes_)->_cached_size_ = (uint)lVar6;
    uVar7 = (uint)lVar6 | 1;
    iVar3 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar4 = (ulong)(iVar3 * 9 + 0x49U >> 6) + lVar6 + 1;
    goto LAB_002e3f6a;
  default:
    sVar4 = 0;
    goto LAB_002e3f6a;
  }
  uVar7 = (uint)uVar5;
  if (uVar8 == 0) {
    uVar8 = 0;
  }
  else if ((int)uVar7 < 0) {
    uVar8 = 0xb;
  }
  else {
    iVar3 = 0x1f;
    if ((uVar7 | 1) != 0) {
      for (; (uVar7 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar8 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
  }
  pTVar1->_values_cached_byte_size_ = uVar7;
  uVar7 = (uint)(uVar8 + uVar5);
  pTVar1->_cached_size_ = uVar7;
  uVar7 = uVar7 | 1;
  iVar3 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  sVar4 = (ulong)(iVar3 * 9 + 0x49U >> 6) + uVar8 + uVar5 + 1;
LAB_002e3f6a:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t TensorValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue)
  size_t total_size = 0;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
    case kFloats: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.floats_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
    case kInts: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.ints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
    case kBools: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.bools_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
    case kStrings: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.strings_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
    case kLongInts: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.longints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
    case kDoubles: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.doubles_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
    case kBytes: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.bytes_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}